

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr,XML_Account account)

{
  uchar uVar1;
  byte bVar2;
  XML_Char XVar3;
  char cVar4;
  DTD *pDVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 *puVar8;
  XML_Char **ppXVar9;
  XML_Bool XVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  XML_Error XVar14;
  uint uVar15;
  XML_Char *pXVar16;
  ATTRIBUTE *pAVar17;
  ATTRIBUTE *pAVar18;
  ATTRIBUTE_ID *pAVar19;
  DEFAULT_ATTRIBUTE *pDVar20;
  NS_ATT *pNVar21;
  NAMED *pNVar22;
  size_t len;
  uint64_t uVar23;
  long lVar24;
  bool bVar25;
  TAG *local_180;
  TAG *p;
  XML_Char *s2;
  XML_Char *s1;
  unsigned_long mask;
  undefined1 local_158 [6];
  uchar step;
  XML_Char c;
  sipkey sip_key;
  siphash sip_state;
  unsigned_long uriHash;
  BINDING *b;
  ATTRIBUTE_ID *id;
  XML_Char *s;
  NS_ATT *temp_1;
  uchar oldNsAttsPower;
  unsigned_long uStack_e0;
  uint nsAttsSize;
  unsigned_long version;
  int j_1;
  XML_Error result_2;
  DEFAULT_ATTRIBUTE *da;
  XML_Error result_1;
  int j;
  XML_Bool isCdata;
  XML_Error result;
  ATTRIBUTE_ID *attId;
  ATTRIBUTE *currAtt;
  ATTRIBUTE *temp;
  int oldAttsSize;
  XML_Char *name;
  XML_Char *localPart;
  BINDING *binding;
  int nPrefixes;
  XML_Char *uri;
  int n;
  int i;
  int prefixLen;
  int attIndex;
  XML_Char **appAtts;
  ELEMENT_TYPE *pEStack_50;
  int nDefaultAtts;
  ELEMENT_TYPE *elementType;
  DTD *dtd;
  XML_Account account_local;
  BINDING **bindingsPtr_local;
  TAG_NAME *tagNamePtr_local;
  char *attStr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  pDVar5 = parser->m_dtd;
  i = 0;
  binding._4_4_ = 0;
  pEStack_50 = (ELEMENT_TYPE *)lookup(parser,&pDVar5->elementTypes,tagNamePtr->str,0);
  if (pEStack_50 == (ELEMENT_TYPE *)0x0) {
    pXVar16 = poolCopyString(&pDVar5->pool,tagNamePtr->str);
    if (pXVar16 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    pEStack_50 = (ELEMENT_TYPE *)lookup(parser,&pDVar5->elementTypes,pXVar16,0x28);
    if (pEStack_50 == (ELEMENT_TYPE *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if ((parser->m_ns != '\0') && (iVar11 = setElementTypePrefix(parser,pEStack_50), iVar11 == 0)) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  iVar11 = pEStack_50->nDefaultAtts;
  iVar12 = (*enc->getAtts)(enc,attStr,parser->m_attsSize,parser->m_atts);
  if (0x7fffffff - iVar11 < iVar12) {
    return XML_ERROR_NO_MEMORY;
  }
  if (parser->m_attsSize < iVar12 + iVar11) {
    iVar13 = parser->m_attsSize;
    if ((0x7fffffef < iVar11) || (0x7fffffff - (iVar11 + 0x10) < iVar12)) {
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attsSize = iVar12 + iVar11 + 0x10;
    pAVar17 = (ATTRIBUTE *)
              (*(parser->m_mem).realloc_fcn)(parser->m_atts,(long)parser->m_attsSize << 5);
    if (pAVar17 == (ATTRIBUTE *)0x0) {
      parser->m_attsSize = iVar13;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = pAVar17;
    if (iVar13 < iVar12) {
      (*enc->getAtts)(enc,attStr,iVar12,parser->m_atts);
    }
  }
  pAVar17 = parser->m_atts;
  for (uri._4_4_ = 0; uri._4_4_ < iVar12; uri._4_4_ = uri._4_4_ + 1) {
    pAVar18 = parser->m_atts + uri._4_4_;
    pcVar6 = pAVar18->name;
    pcVar7 = pAVar18->name;
    iVar13 = (*enc->nameLength)(enc,pAVar18->name);
    pAVar19 = getAttributeId(parser,enc,pcVar6,pcVar7 + iVar13);
    if (pAVar19 == (ATTRIBUTE_ID *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    if (pAVar19->name[-1] != '\0') {
      if (enc == parser->m_encoding) {
        parser->m_eventPtr = parser->m_atts[uri._4_4_].name;
      }
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    pAVar19->name[-1] = '\x01';
    iVar13 = i + 1;
    (&pAVar17->name)[i] = pAVar19->name;
    if (parser->m_atts[uri._4_4_].normalized == '\0') {
      result_1._3_1_ = 1;
      if (pAVar19->maybeTokenized != '\0') {
        for (da._4_4_ = 0; da._4_4_ < iVar11; da._4_4_ = da._4_4_ + 1) {
          if (pAVar19 == pEStack_50->defaultAtts[da._4_4_].id) {
            result_1._3_1_ = pEStack_50->defaultAtts[da._4_4_].isCdata;
            break;
          }
        }
      }
      XVar14 = storeAttributeValue(parser,enc,result_1._3_1_,parser->m_atts[uri._4_4_].valuePtr,
                                   parser->m_atts[uri._4_4_].valueEnd,&parser->m_tempPool,account);
      if (XVar14 != XML_ERROR_NONE) {
        return XVar14;
      }
      (&pAVar17->name)[iVar13] = (parser->m_tempPool).start;
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
    }
    else {
      pXVar16 = poolStoreString(&parser->m_tempPool,enc,parser->m_atts[uri._4_4_].valuePtr,
                                parser->m_atts[uri._4_4_].valueEnd);
      (&pAVar17->name)[iVar13] = pXVar16;
      if ((&pAVar17->name)[iVar13] == (char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
    }
    if (pAVar19->prefix == (PREFIX *)0x0) {
      i = i + 2;
    }
    else if (pAVar19->xmlns == '\0') {
      i = i + 2;
      binding._4_4_ = binding._4_4_ + 1;
      pAVar19->name[-1] = '\x02';
    }
    else {
      XVar14 = addBinding(parser,pAVar19->prefix,pAVar19,(&pAVar17->name)[iVar13],bindingsPtr);
      if (XVar14 != XML_ERROR_NONE) {
        return XVar14;
      }
    }
  }
  parser->m_nSpecifiedAtts = i;
  if ((pEStack_50->idAtt == (ATTRIBUTE_ID *)0x0) || (pEStack_50->idAtt->name[-1] == '\0')) {
    parser->m_idAttIndex = -1;
  }
  else {
    for (uri._4_4_ = 0; uri._4_4_ < i; uri._4_4_ = uri._4_4_ + 2) {
      if ((&pAVar17->name)[uri._4_4_] == pEStack_50->idAtt->name) {
        parser->m_idAttIndex = uri._4_4_;
        break;
      }
    }
  }
  for (uri._4_4_ = 0; uri._4_4_ < iVar11; uri._4_4_ = uri._4_4_ + 1) {
    pDVar20 = pEStack_50->defaultAtts + uri._4_4_;
    if ((pDVar20->id->name[-1] == '\0') && (pDVar20->value != (XML_Char *)0x0)) {
      if (pDVar20->id->prefix == (PREFIX *)0x0) {
        pDVar20->id->name[-1] = '\x01';
        iVar12 = i + 1;
        (&pAVar17->name)[i] = pDVar20->id->name;
        i = i + 2;
        (&pAVar17->name)[iVar12] = pDVar20->value;
      }
      else if (pDVar20->id->xmlns == '\0') {
        pDVar20->id->name[-1] = '\x02';
        binding._4_4_ = binding._4_4_ + 1;
        iVar12 = i + 1;
        (&pAVar17->name)[i] = pDVar20->id->name;
        i = i + 2;
        (&pAVar17->name)[iVar12] = pDVar20->value;
      }
      else {
        XVar14 = addBinding(parser,pDVar20->id->prefix,pDVar20->id,pDVar20->value,bindingsPtr);
        if (XVar14 != XML_ERROR_NONE) {
          return XVar14;
        }
      }
    }
  }
  (&pAVar17->name)[i] = (char *)0x0;
  uri._4_4_ = 0;
  if (binding._4_4_ != 0) {
    uStack_e0 = parser->m_nsAttsVersion;
    if (0x1f < parser->m_nsAttsPower) {
      return XML_ERROR_NO_MEMORY;
    }
    temp_1._4_4_ = 1 << (parser->m_nsAttsPower & 0x1f);
    uVar1 = parser->m_nsAttsPower;
    if ((binding._4_4_ << 1) >> (parser->m_nsAttsPower & 0x1f) != 0) {
      do {
        bVar2 = parser->m_nsAttsPower;
        parser->m_nsAttsPower = bVar2 + 1;
      } while (binding._4_4_ >> (bVar2 & 0x1f) != 0);
      if (parser->m_nsAttsPower < 3) {
        parser->m_nsAttsPower = '\x03';
      }
      if (0x1f < parser->m_nsAttsPower) {
        parser->m_nsAttsPower = uVar1;
        return XML_ERROR_NO_MEMORY;
      }
      temp_1._4_4_ = 1 << (parser->m_nsAttsPower & 0x1f);
      pNVar21 = (NS_ATT *)
                (*(parser->m_mem).realloc_fcn)(parser->m_nsAtts,(ulong)temp_1._4_4_ * 0x18);
      if (pNVar21 == (NS_ATT *)0x0) {
        parser->m_nsAttsPower = uVar1;
        return XML_ERROR_NO_MEMORY;
      }
      parser->m_nsAtts = pNVar21;
      uStack_e0 = 0;
    }
    if (uStack_e0 == 0) {
      uStack_e0 = 0xffffffff;
      version._0_4_ = temp_1._4_4_;
      while ((uint)version != 0) {
        version._0_4_ = (uint)version - 1;
        parser->m_nsAtts[(int)(uint)version].version = 0xffffffff;
      }
    }
    uStack_e0 = uStack_e0 - 1;
    parser->m_nsAttsVersion = uStack_e0;
    for (; uri._4_4_ < i; uri._4_4_ = uri._4_4_ + 2) {
      id = (ATTRIBUTE_ID *)(&pAVar17->name)[uri._4_4_];
      if (id[-1].field_0x17 == '\x02') {
        copy_salt_to_sipkey(parser,(sipkey *)local_158);
        sip24_init((siphash *)(sip_key.k + 1),(sipkey *)local_158);
        id[-1].field_0x17 = 0;
        pNVar22 = lookup(parser,&pDVar5->attributeIds,(KEY)id,0);
        if ((pNVar22 == (NAMED *)0x0) || (pNVar22[1].name == (KEY)0x0)) {
          return XML_ERROR_NO_MEMORY;
        }
        puVar8 = *(undefined8 **)(pNVar22[1].name + 8);
        if (puVar8 == (undefined8 *)0x0) {
          return XML_ERROR_UNBOUND_PREFIX;
        }
        for (version._0_4_ = 0; (int)(uint)version < *(int *)(puVar8 + 5);
            version._0_4_ = (uint)version + 1) {
          XVar3 = *(XML_Char *)(puVar8[4] + (long)(int)(uint)version);
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar10 = poolGrow(&parser->m_tempPool), XVar10 == '\0')) {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar16 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar16 + 1;
          *pXVar16 = XVar3;
        }
        sip24_update((siphash *)(sip_key.k + 1),(void *)puVar8[4],(long)*(int *)(puVar8 + 5));
        do {
          pAVar19 = (ATTRIBUTE_ID *)((long)&id->name + 1);
          ppXVar9 = &id->name;
          id = pAVar19;
        } while (*(char *)ppXVar9 != ':');
        len = keylen((KEY)pAVar19);
        sip24_update((siphash *)(sip_key.k + 1),pAVar19,len);
        do {
          if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
             (XVar10 = poolGrow(&parser->m_tempPool), XVar10 == '\0')) {
            return XML_ERROR_NO_MEMORY;
          }
          XVar3 = *(XML_Char *)&id->name;
          pXVar16 = (parser->m_tempPool).ptr;
          (parser->m_tempPool).ptr = pXVar16 + 1;
          *pXVar16 = XVar3;
          ppXVar9 = &id->name;
          id = (ATTRIBUTE_ID *)((long)&id->name + 1);
        } while (*(char *)ppXVar9 != '\0');
        uVar23 = sip24_final((siphash *)(sip_key.k + 1));
        mask._6_1_ = 0;
        uVar15 = temp_1._4_4_ - 1;
        version._0_4_ = (uint)uVar23 & uVar15;
        while (parser->m_nsAtts[(int)(uint)version].version == uStack_e0) {
          if (uVar23 == parser->m_nsAtts[(int)(uint)version].hash) {
            s2 = (parser->m_tempPool).start;
            p = (TAG *)parser->m_nsAtts[(int)(uint)version].uriName;
            while( true ) {
              bVar25 = false;
              if (*s2 == *(char *)&p->parent) {
                bVar25 = *s2 != '\0';
              }
              if (!bVar25) break;
              s2 = s2 + 1;
              p = (TAG *)((long)&p->parent + 1);
            }
            if (*s2 == '\0') {
              return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
          }
          if (mask._6_1_ == 0) {
            mask._6_1_ = (byte)((uVar23 & ((ulong)uVar15 ^ 0xffffffffffffffff)) >>
                               (parser->m_nsAttsPower - 1 & 0x3f)) & (byte)(uVar15 >> 2) | 1;
          }
          if ((int)(uint)version < (int)(uint)mask._6_1_) {
            iVar11 = temp_1._4_4_ - mask._6_1_;
          }
          else {
            iVar11 = -(uint)mask._6_1_;
          }
          version._0_4_ = iVar11 + (uint)version;
        }
        if (parser->m_ns_triplets != '\0') {
          (parser->m_tempPool).ptr[-1] = parser->m_namespaceSeparator;
          id = *(ATTRIBUTE_ID **)*puVar8;
          do {
            if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
               (XVar10 = poolGrow(&parser->m_tempPool), XVar10 == '\0')) {
              return XML_ERROR_NO_MEMORY;
            }
            XVar3 = *(XML_Char *)&id->name;
            pXVar16 = (parser->m_tempPool).ptr;
            (parser->m_tempPool).ptr = pXVar16 + 1;
            *pXVar16 = XVar3;
            ppXVar9 = &id->name;
            id = (ATTRIBUTE_ID *)((long)&id->name + 1);
          } while (*(char *)ppXVar9 != '\0');
        }
        pcVar6 = (parser->m_tempPool).start;
        (parser->m_tempPool).start = (parser->m_tempPool).ptr;
        (&pAVar17->name)[uri._4_4_] = pcVar6;
        parser->m_nsAtts[(int)(uint)version].version = uStack_e0;
        parser->m_nsAtts[(int)(uint)version].hash = uVar23;
        parser->m_nsAtts[(int)(uint)version].uriName = pcVar6;
        binding._4_4_ = binding._4_4_ + -1;
        if (binding._4_4_ == 0) {
          uri._4_4_ = uri._4_4_ + 2;
          break;
        }
      }
      else {
        id[-1].field_0x17 = 0;
      }
    }
  }
  for (; uri._4_4_ < i; uri._4_4_ = uri._4_4_ + 2) {
    (&pAVar17->name)[uri._4_4_][-1] = '\0';
  }
  for (localPart = (XML_Char *)*bindingsPtr; localPart != (XML_Char *)0x0;
      localPart = *(XML_Char **)(localPart + 8)) {
    *(undefined1 *)(**(long **)(localPart + 0x18) + -1) = 0;
  }
  if (parser->m_ns == '\0') {
    parser_local._4_4_ = XML_ERROR_NONE;
  }
  else {
    if (pEStack_50->prefix == (PREFIX *)0x0) {
      if ((pDVar5->defaultPrefix).binding == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      localPart = (XML_Char *)(pDVar5->defaultPrefix).binding;
      name = tagNamePtr->str;
    }
    else {
      localPart = (XML_Char *)pEStack_50->prefix->binding;
      if ((BINDING *)localPart == (BINDING *)0x0) {
        return XML_ERROR_UNBOUND_PREFIX;
      }
      name = tagNamePtr->str;
      do {
        pXVar16 = name + 1;
        cVar4 = *name;
        name = pXVar16;
      } while (cVar4 != ':');
    }
    n = 0;
    if ((parser->m_ns_triplets != '\0') && (**(long **)localPart != 0)) {
      do {
        iVar11 = n + 1;
        lVar24 = (long)n;
        n = iVar11;
      } while (*(char *)(**(long **)localPart + lVar24) != '\0');
    }
    tagNamePtr->localPart = name;
    tagNamePtr->uriLen = *(int *)(localPart + 0x28);
    tagNamePtr->prefix = (XML_Char *)**(undefined8 **)localPart;
    tagNamePtr->prefixLen = n;
    uri._4_4_ = 0;
    iVar11 = uri._4_4_;
    do {
      uri._4_4_ = iVar11;
      iVar11 = uri._4_4_ + 1;
    } while (name[uri._4_4_] != '\0');
    if ((0x7fffffff - n < *(int *)(localPart + 0x28)) ||
       (0x7fffffff - (*(int *)(localPart + 0x28) + n) < iVar11)) {
      parser_local._4_4_ = XML_ERROR_NO_MEMORY;
    }
    else {
      iVar12 = iVar11 + *(int *)(localPart + 0x28) + n;
      if (*(int *)(localPart + 0x2c) < iVar12) {
        if (0x7fffffe7 < iVar12) {
          return XML_ERROR_NO_MEMORY;
        }
        pXVar16 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((long)(iVar12 + 0x18));
        if (pXVar16 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        *(int *)(localPart + 0x2c) = iVar12 + 0x18;
        memcpy(pXVar16,*(void **)(localPart + 0x20),(long)*(int *)(localPart + 0x28));
        for (local_180 = parser->m_tagStack; local_180 != (TAG *)0x0; local_180 = local_180->parent)
        {
          if ((local_180->name).str == *(XML_Char **)(localPart + 0x20)) {
            (local_180->name).str = pXVar16;
          }
        }
        (*(parser->m_mem).free_fcn)(*(void **)(localPart + 0x20));
        *(XML_Char **)(localPart + 0x20) = pXVar16;
      }
      lVar24 = *(long *)(localPart + 0x20);
      iVar12 = *(int *)(localPart + 0x28);
      memcpy((void *)(lVar24 + iVar12),name,(long)iVar11);
      if (n != 0) {
        pXVar16 = (XML_Char *)(lVar24 + iVar12 + (long)uri._4_4_);
        *pXVar16 = parser->m_namespaceSeparator;
        memcpy(pXVar16 + 1,(void *)**(undefined8 **)localPart,(long)n);
      }
      tagNamePtr->str = *(XML_Char **)(localPart + 0x20);
      parser_local._4_4_ = XML_ERROR_NONE;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error
storeAtts(XML_Parser parser, const ENCODING *enc, const char *attStr,
          TAG_NAME *tagNamePtr, BINDING **bindingsPtr,
          enum XML_Account account) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ELEMENT_TYPE *elementType;
  int nDefaultAtts;
  const XML_Char **appAtts; /* the attribute list for the application */
  int attIndex = 0;
  int prefixLen;
  int i;
  int n;
  XML_Char *uri;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  elementType
      = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, tagNamePtr->str, 0);
  if (! elementType) {
    const XML_Char *name = poolCopyString(&dtd->pool, tagNamePtr->str);
    if (! name)
      return XML_ERROR_NO_MEMORY;
    elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                                         sizeof(ELEMENT_TYPE));
    if (! elementType)
      return XML_ERROR_NO_MEMORY;
    if (parser->m_ns && ! setElementTypePrefix(parser, elementType))
      return XML_ERROR_NO_MEMORY;
  }
  nDefaultAtts = elementType->nDefaultAtts;

  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, parser->m_attsSize, parser->m_atts);

  /* Detect and prevent integer overflow */
  if (n > INT_MAX - nDefaultAtts) {
    return XML_ERROR_NO_MEMORY;
  }

  if (n + nDefaultAtts > parser->m_attsSize) {
    int oldAttsSize = parser->m_attsSize;
    ATTRIBUTE *temp;
#ifdef XML_ATTR_INFO
    XML_AttrInfo *temp2;
#endif

    /* Detect and prevent integer overflow */
    if ((nDefaultAtts > INT_MAX - INIT_ATTS_SIZE)
        || (n > INT_MAX - (nDefaultAtts + INIT_ATTS_SIZE))) {
      return XML_ERROR_NO_MEMORY;
    }

    parser->m_attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;

    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(ATTRIBUTE)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#endif

    temp = (ATTRIBUTE *)REALLOC(parser, (void *)parser->m_atts,
                                parser->m_attsSize * sizeof(ATTRIBUTE));
    if (temp == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = temp;
#ifdef XML_ATTR_INFO
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#  if UINT_MAX >= SIZE_MAX
    if ((unsigned)parser->m_attsSize > (size_t)(-1) / sizeof(XML_AttrInfo)) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
#  endif

    temp2 = (XML_AttrInfo *)REALLOC(parser, (void *)parser->m_attInfo,
                                    parser->m_attsSize * sizeof(XML_AttrInfo));
    if (temp2 == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attInfo = temp2;
#endif
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, parser->m_atts);
  }

  appAtts = (const XML_Char **)parser->m_atts;
  for (i = 0; i < n; i++) {
    ATTRIBUTE *currAtt = &parser->m_atts[i];
#ifdef XML_ATTR_INFO
    XML_AttrInfo *currAttInfo = &parser->m_attInfo[i];
#endif
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId
        = getAttributeId(parser, enc, currAtt->name,
                         currAtt->name + XmlNameLength(enc, currAtt->name));
    if (! attId)
      return XML_ERROR_NO_MEMORY;
#ifdef XML_ATTR_INFO
    currAttInfo->nameStart
        = parser->m_parseEndByteIndex - (parser->m_parseEndPtr - currAtt->name);
    currAttInfo->nameEnd
        = currAttInfo->nameStart + XmlNameLength(enc, currAtt->name);
    currAttInfo->valueStart = parser->m_parseEndByteIndex
                              - (parser->m_parseEndPtr - currAtt->valuePtr);
    currAttInfo->valueEnd = parser->m_parseEndByteIndex
                            - (parser->m_parseEndPtr - currAtt->valueEnd);
#endif
    /* Detect duplicate attributes by their QNames. This does not work when
       namespace processing is turned on and different prefixes for the same
       namespace are used. For this case we have a check further down.
    */
    if ((attId->name)[-1]) {
      if (enc == parser->m_encoding)
        parser->m_eventPtr = parser->m_atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (! parser->m_atts[i].normalized) {
      enum XML_Error result;
      XML_Bool isCdata = XML_TRUE;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(
          parser, enc, isCdata, parser->m_atts[i].valuePtr,
          parser->m_atts[i].valueEnd, &parser->m_tempPool, account);
      if (result)
        return result;
      appAtts[attIndex] = poolStart(&parser->m_tempPool);
      poolFinish(&parser->m_tempPool);
    } else {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&parser->m_tempPool, enc,
                                          parser->m_atts[i].valuePtr,
                                          parser->m_atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&parser->m_tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        enum XML_Error result = addBinding(parser, attId->prefix, attId,
                                           appAtts[attIndex], bindingsPtr);
        if (result)
          return result;
        --attIndex;
      } else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    } else
      attIndex++;
  }

  /* set-up for XML_GetSpecifiedAttributeCount and XML_GetIdAttributeIndex */
  parser->m_nSpecifiedAtts = attIndex;
  if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
    for (i = 0; i < attIndex; i += 2)
      if (appAtts[i] == elementType->idAtt->name) {
        parser->m_idAttIndex = i;
        break;
      }
  } else
    parser->m_idAttIndex = -1;

  /* do attribute defaulting */
  for (i = 0; i < nDefaultAtts; i++) {
    const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + i;
    if (! (da->id->name)[-1] && da->value) {
      if (da->id->prefix) {
        if (da->id->xmlns) {
          enum XML_Error result = addBinding(parser, da->id->prefix, da->id,
                                             da->value, bindingsPtr);
          if (result)
            return result;
        } else {
          (da->id->name)[-1] = 2;
          nPrefixes++;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      } else {
        (da->id->name)[-1] = 1;
        appAtts[attIndex++] = da->id->name;
        appAtts[attIndex++] = da->value;
      }
    }
  }
  appAtts[attIndex] = 0;

  /* expand prefixed attribute names, check for duplicates,
     and clear flags that say whether attributes were specified */
  i = 0;
  if (nPrefixes) {
    int j; /* hash table index */
    unsigned long version = parser->m_nsAttsVersion;

    /* Detect and prevent invalid shift */
    if (parser->m_nsAttsPower >= sizeof(unsigned int) * 8 /* bits per byte */) {
      return XML_ERROR_NO_MEMORY;
    }

    unsigned int nsAttsSize = 1u << parser->m_nsAttsPower;
    unsigned char oldNsAttsPower = parser->m_nsAttsPower;
    /* size of hash table must be at least 2 * (# of prefixed attributes) */
    if ((nPrefixes << 1)
        >> parser->m_nsAttsPower) { /* true for m_nsAttsPower = 0 */
      NS_ATT *temp;
      /* hash table size must also be a power of 2 and >= 8 */
      while (nPrefixes >> parser->m_nsAttsPower++)
        ;
      if (parser->m_nsAttsPower < 3)
        parser->m_nsAttsPower = 3;

      /* Detect and prevent invalid shift */
      if (parser->m_nsAttsPower >= sizeof(nsAttsSize) * 8 /* bits per byte */) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }

      nsAttsSize = 1u << parser->m_nsAttsPower;

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if (nsAttsSize > (size_t)(-1) / sizeof(NS_ATT)) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
#endif

      temp = (NS_ATT *)REALLOC(parser, parser->m_nsAtts,
                               nsAttsSize * sizeof(NS_ATT));
      if (! temp) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
      parser->m_nsAtts = temp;
      version = 0; /* force re-initialization of m_nsAtts hash table */
    }
    /* using a version flag saves us from initializing m_nsAtts every time */
    if (! version) { /* initialize version flags when version wraps around */
      version = INIT_ATTS_VERSION;
      for (j = nsAttsSize; j != 0;)
        parser->m_nsAtts[--j].version = version;
    }
    parser->m_nsAttsVersion = --version;

    /* expand prefixed names and check for duplicates */
    for (; i < attIndex; i += 2) {
      const XML_Char *s = appAtts[i];
      if (s[-1] == 2) { /* prefixed */
        ATTRIBUTE_ID *id;
        const BINDING *b;
        unsigned long uriHash;
        struct siphash sip_state;
        struct sipkey sip_key;

        copy_salt_to_sipkey(parser, &sip_key);
        sip24_init(&sip_state, &sip_key);

        ((XML_Char *)s)[-1] = 0; /* clear flag */
        id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, s, 0);
        if (! id || ! id->prefix) {
          /* This code is walking through the appAtts array, dealing
           * with (in this case) a prefixed attribute name.  To be in
           * the array, the attribute must have already been bound, so
           * has to have passed through the hash table lookup once
           * already.  That implies that an entry for it already
           * exists, so the lookup above will return a pointer to
           * already allocated memory.  There is no opportunaity for
           * the allocator to fail, so the condition above cannot be
           * fulfilled.
           *
           * Since it is difficult to be certain that the above
           * analysis is complete, we retain the test and merely
           * remove the code from coverage tests.
           */
          return XML_ERROR_NO_MEMORY; /* LCOV_EXCL_LINE */
        }
        b = id->prefix->binding;
        if (! b)
          return XML_ERROR_UNBOUND_PREFIX;

        for (j = 0; j < b->uriLen; j++) {
          const XML_Char c = b->uri[j];
          if (! poolAppendChar(&parser->m_tempPool, c))
            return XML_ERROR_NO_MEMORY;
        }

        sip24_update(&sip_state, b->uri, b->uriLen * sizeof(XML_Char));

        while (*s++ != XML_T(ASCII_COLON))
          ;

        sip24_update(&sip_state, s, keylen(s) * sizeof(XML_Char));

        do { /* copies null terminator */
          if (! poolAppendChar(&parser->m_tempPool, *s))
            return XML_ERROR_NO_MEMORY;
        } while (*s++);

        uriHash = (unsigned long)sip24_final(&sip_state);

        { /* Check hash table for duplicate of expanded name (uriName).
             Derived from code in lookup(parser, HASH_TABLE *table, ...).
          */
          unsigned char step = 0;
          unsigned long mask = nsAttsSize - 1;
          j = uriHash & mask; /* index into hash table */
          while (parser->m_nsAtts[j].version == version) {
            /* for speed we compare stored hash values first */
            if (uriHash == parser->m_nsAtts[j].hash) {
              const XML_Char *s1 = poolStart(&parser->m_tempPool);
              const XML_Char *s2 = parser->m_nsAtts[j].uriName;
              /* s1 is null terminated, but not s2 */
              for (; *s1 == *s2 && *s1 != 0; s1++, s2++)
                ;
              if (*s1 == 0)
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
            if (! step)
              step = PROBE_STEP(uriHash, mask, parser->m_nsAttsPower);
            j < step ? (j += nsAttsSize - step) : (j -= step);
          }
        }

        if (parser->m_ns_triplets) { /* append namespace separator and prefix */
          parser->m_tempPool.ptr[-1] = parser->m_namespaceSeparator;
          s = b->prefix->name;
          do {
            if (! poolAppendChar(&parser->m_tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
        }

        /* store expanded name in attribute list */
        s = poolStart(&parser->m_tempPool);
        poolFinish(&parser->m_tempPool);
        appAtts[i] = s;

        /* fill empty slot with new version, uriName and hash value */
        parser->m_nsAtts[j].version = version;
        parser->m_nsAtts[j].hash = uriHash;
        parser->m_nsAtts[j].uriName = s;

        if (! --nPrefixes) {
          i += 2;
          break;
        }
      } else                     /* not prefixed */
        ((XML_Char *)s)[-1] = 0; /* clear flag */
    }
  }
  /* clear flags for the remaining attributes */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;

  if (! parser->m_ns)
    return XML_ERROR_NONE;

  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (! binding)
      return XML_ERROR_UNBOUND_PREFIX;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(ASCII_COLON))
      ;
  } else if (dtd->defaultPrefix.binding) {
    binding = dtd->defaultPrefix.binding;
    localPart = tagNamePtr->str;
  } else
    return XML_ERROR_NONE;
  prefixLen = 0;
  if (parser->m_ns_triplets && binding->prefix->name) {
    for (; binding->prefix->name[prefixLen++];)
      ; /* prefixLen includes null terminator */
  }
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  tagNamePtr->prefix = binding->prefix->name;
  tagNamePtr->prefixLen = prefixLen;
  for (i = 0; localPart[i++];)
    ; /* i includes null terminator */

  /* Detect and prevent integer overflow */
  if (binding->uriLen > INT_MAX - prefixLen
      || i > INT_MAX - (binding->uriLen + prefixLen)) {
    return XML_ERROR_NO_MEMORY;
  }

  n = i + binding->uriLen + prefixLen;
  if (n > binding->uriAlloc) {
    TAG *p;

    /* Detect and prevent integer overflow */
    if (n > INT_MAX - EXPAND_SPARE) {
      return XML_ERROR_NO_MEMORY;
    }
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)(n + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
      return XML_ERROR_NO_MEMORY;
    }
#endif

    uri = (XML_Char *)MALLOC(parser, (n + EXPAND_SPARE) * sizeof(XML_Char));
    if (! uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = parser->m_tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(parser, binding->uri);
    binding->uri = uri;
  }
  /* if m_namespaceSeparator != '\0' then uri includes it already */
  uri = binding->uri + binding->uriLen;
  memcpy(uri, localPart, i * sizeof(XML_Char));
  /* we always have a namespace separator between localPart and prefix */
  if (prefixLen) {
    uri += i - 1;
    *uri = parser->m_namespaceSeparator; /* replace null terminator */
    memcpy(uri + 1, binding->prefix->name, prefixLen * sizeof(XML_Char));
  }
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}